

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_ci
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  VkPipeline *ppVVar1;
  bool bVar2;
  uint local_2c;
  uint32_t i;
  VkPipeline *libraries;
  VkRayTracingPipelineCreateInfoKHR *info_local;
  Impl *this_local;
  
  bVar2 = remap_shader_module_handles<VkRayTracingPipelineCreateInfoKHR>(this,info);
  if (bVar2) {
    if ((info->basePipelineHandle == (VkPipeline)0x0) ||
       (bVar2 = remap_raytracing_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), bVar2)) {
      bVar2 = remap_pipeline_layout_handle(this,info->layout,&info->layout);
      if (bVar2) {
        if (info->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
          ppVVar1 = info->pLibraryInfo->pLibraries;
          for (local_2c = 0; local_2c < info->pLibraryInfo->libraryCount; local_2c = local_2c + 1) {
            bVar2 = remap_raytracing_pipeline_handle(this,ppVVar1[local_2c],ppVVar1 + local_2c);
            if (!bVar2) {
              return false;
            }
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_ci(VkRayTracingPipelineCreateInfoKHR *info)
{
	if (!remap_shader_module_handles(info))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_raytracing_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	if (info->pLibraryInfo)
	{
		auto *libraries = const_cast<VkPipeline *>(info->pLibraryInfo->pLibraries);
		for (uint32_t i = 0; i < info->pLibraryInfo->libraryCount; i++)
		{
			if (!remap_raytracing_pipeline_handle(libraries[i], &libraries[i]))
				return false;
		}
	}

	return true;
}